

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O3

bool __thiscall CBloomFilter::IsRelevantAndUpdate(CBloomFilter *this,CTransaction *tx)

{
  pointer pCVar1;
  bool bVar2;
  byte bVar3;
  TxoutType TVar4;
  pointer pCVar5;
  CScript *pCVar6;
  uint uVar7;
  ulong uVar8;
  pointer outpoint;
  CScript *pCVar9;
  const_iterator end;
  CScript *pCVar10;
  uint uVar11;
  uint32_t uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  Span<const_unsigned_char> vKey_01;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  opcodetype opcode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  const_iterator pc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_1;
  bool local_b9;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_a8;
  opcodetype local_8c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  const_iterator local_70;
  undefined1 local_68 [8];
  pointer puStack_60;
  pointer local_58;
  uchar auStack_50 [8];
  uint32_t local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = true;
  if ((this->vData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->vData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    vKey.m_data = &tx->hash;
    vKey.m_size = 0x20;
    local_b9 = contains(this,vKey);
    pCVar5 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar5) {
      uVar13 = 0;
      do {
        pCVar10 = &pCVar5[uVar13].scriptPubKey;
        local_70.ptr = (uchar *)pCVar10;
        if (0x1c < pCVar5[uVar13].scriptPubKey.super_CScriptBase._size) {
          local_70.ptr = (uchar *)pCVar5[uVar13].scriptPubKey.super_CScriptBase._union.
                                  indirect_contents.indirect;
        }
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar7 = pCVar5[uVar13].scriptPubKey.super_CScriptBase._size;
        uVar11 = uVar7 - 0x1d;
        if (uVar7 < 0x1d) {
          uVar11 = uVar7;
        }
        pCVar9 = (CScript *)
                 pCVar5[uVar13].scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
        pCVar6 = pCVar9;
        if (uVar7 < 0x1d) {
          pCVar6 = pCVar10;
        }
        uVar12 = (uint32_t)uVar13;
        if (local_70.ptr < (pCVar6->super_CScriptBase)._union.direct + (int)uVar11) {
          do {
            uVar11 = uVar7 - 0x1d;
            if (uVar7 < 0x1d) {
              uVar11 = uVar7;
            }
            if (uVar7 < 0x1d) {
              pCVar9 = pCVar10;
            }
            bVar2 = GetScriptOp(&local_70,
                                (uchar *)((long)&(pCVar9->super_CScriptBase)._union +
                                         (long)(int)uVar11),&local_8c,&local_88);
            if (!bVar2) break;
            vKey_00.m_size =
                 (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            if ((vKey_00.m_size != 0) &&
               (vKey_00.m_data =
                     local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start, bVar2 = contains(this,vKey_00), bVar2
               )) {
              bVar3 = this->nFlags & 3;
              local_b9 = true;
              if (bVar3 == 2) {
                local_a8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_a8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_a8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                TVar4 = Solver(pCVar10,&local_a8);
                if ((TVar4 == MULTISIG) || (TVar4 == PUBKEY)) {
                  local_68 = *(undefined1 (*) [8])
                              ((vKey.m_data)->m_wrapped).super_base_blob<256U>.m_data._M_elems;
                  puStack_60 = *(pointer *)
                                ((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
                  local_58 = *(pointer *)
                              ((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
                  auStack_50 = *(uchar (*) [8])
                                ((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
                  local_48 = uVar12;
                  insert(this,(COutPoint *)local_68);
                }
                std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::~vector(&local_a8);
              }
              else if (bVar3 == 1) {
                local_68 = *(undefined1 (*) [8])
                            ((vKey.m_data)->m_wrapped).super_base_blob<256U>.m_data._M_elems;
                puStack_60 = *(pointer *)
                              ((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
                local_58 = *(pointer *)
                            ((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
                auStack_50 = *(uchar (*) [8])
                              ((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
                local_48 = uVar12;
                insert(this,(COutPoint *)local_68);
              }
              break;
            }
            uVar7 = pCVar5[uVar13].scriptPubKey.super_CScriptBase._size;
            uVar11 = uVar7 - 0x1d;
            if (uVar7 < 0x1d) {
              uVar11 = uVar7;
            }
            pCVar9 = (CScript *)(pCVar10->super_CScriptBase)._union.indirect_contents.indirect;
            pCVar6 = pCVar9;
            if (uVar7 < 0x1d) {
              pCVar6 = pCVar10;
            }
          } while (local_70.ptr < (pCVar6->super_CScriptBase)._union.direct + (int)uVar11);
        }
        if ((CScript *)
            local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (CScript *)0x0) {
          operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar13 = (ulong)(uVar12 + 1);
        pCVar5 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = ((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar5 >> 3) * -0x3333333333333333;
      } while (uVar13 <= uVar8 && uVar8 - uVar13 != 0);
    }
    if (local_b9 == false) {
      outpoint = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (outpoint != pCVar1) {
        do {
          bVar2 = contains(this,&outpoint->prevout);
          if (bVar2) goto LAB_00d4669e;
          uVar7 = (outpoint->scriptSig).super_CScriptBase._size;
          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(outpoint->scriptSig).super_CScriptBase._union.indirect_contents.indirect;
          if (uVar7 < 0x1d) {
            local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)&outpoint->scriptSig;
          }
          local_68 = (undefined1  [8])0x0;
          puStack_60 = (pointer)0x0;
          local_58 = (pointer)0x0;
          uVar11 = uVar7 - 0x1d;
          if (uVar7 < 0x1d) {
            uVar11 = uVar7;
          }
          if ((int)uVar11 < 1) {
            bVar2 = true;
          }
          else {
            end.ptr = (uchar *)((long)&(((CScript *)
                                        local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                       super_CScriptBase)._union + (ulong)uVar11);
            do {
              bVar2 = GetScriptOp((const_iterator *)&local_88,end,(opcodetype *)&local_a8,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68)
              ;
              if (!bVar2) break;
              vKey_01.m_size = (long)puStack_60 - (long)local_68;
              if ((vKey_01.m_size != 0) &&
                 (vKey_01.m_data = (uchar *)local_68, bVar2 = contains(this,vKey_01), bVar2)) {
                bVar2 = false;
                goto LAB_00d46770;
              }
              uVar7 = (outpoint->scriptSig).super_CScriptBase._size;
              uVar11 = uVar7 - 0x1d;
              if (uVar7 < 0x1d) {
                uVar11 = uVar7;
              }
              pCVar10 = (CScript *)
                        (outpoint->scriptSig).super_CScriptBase._union.indirect_contents.indirect;
              if (uVar7 < 0x1d) {
                pCVar10 = &outpoint->scriptSig;
              }
              end.ptr = (uchar *)((long)&(pCVar10->super_CScriptBase)._union + (long)(int)uVar11);
            } while (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start < end.ptr);
            bVar2 = true;
          }
LAB_00d46770:
          if (local_68 != (undefined1  [8])0x0) {
            operator_delete((void *)local_68,(long)local_58 - (long)local_68);
          }
          if (!bVar2) goto LAB_00d4669e;
          outpoint = outpoint + 1;
        } while (outpoint != pCVar1);
      }
      bVar2 = false;
    }
    else {
LAB_00d4669e:
      bVar2 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool CBloomFilter::IsRelevantAndUpdate(const CTransaction& tx)
{
    bool fFound = false;
    // Match if the filter contains the hash of tx
    //  for finding tx when they appear in a block
    if (vData.empty()) // zero-size = "match-all" filter
        return true;
    const Txid& hash = tx.GetHash();
    if (contains(hash.ToUint256()))
        fFound = true;

    for (unsigned int i = 0; i < tx.vout.size(); i++)
    {
        const CTxOut& txout = tx.vout[i];
        // Match if the filter contains any arbitrary script data element in any scriptPubKey in tx
        // If this matches, also add the specific output that was matched.
        // This means clients don't have to update the filter themselves when a new relevant tx
        // is discovered in order to find spending transactions, which avoids round-tripping and race conditions.
        CScript::const_iterator pc = txout.scriptPubKey.begin();
        std::vector<unsigned char> data;
        while (pc < txout.scriptPubKey.end())
        {
            opcodetype opcode;
            if (!txout.scriptPubKey.GetOp(pc, opcode, data))
                break;
            if (data.size() != 0 && contains(data))
            {
                fFound = true;
                if ((nFlags & BLOOM_UPDATE_MASK) == BLOOM_UPDATE_ALL)
                    insert(COutPoint(hash, i));
                else if ((nFlags & BLOOM_UPDATE_MASK) == BLOOM_UPDATE_P2PUBKEY_ONLY)
                {
                    std::vector<std::vector<unsigned char> > vSolutions;
                    TxoutType type = Solver(txout.scriptPubKey, vSolutions);
                    if (type == TxoutType::PUBKEY || type == TxoutType::MULTISIG) {
                        insert(COutPoint(hash, i));
                    }
                }
                break;
            }
        }
    }

    if (fFound)
        return true;

    for (const CTxIn& txin : tx.vin)
    {
        // Match if the filter contains an outpoint tx spends
        if (contains(txin.prevout))
            return true;

        // Match if the filter contains any arbitrary script data element in any scriptSig in tx
        CScript::const_iterator pc = txin.scriptSig.begin();
        std::vector<unsigned char> data;
        while (pc < txin.scriptSig.end())
        {
            opcodetype opcode;
            if (!txin.scriptSig.GetOp(pc, opcode, data))
                break;
            if (data.size() != 0 && contains(data))
                return true;
        }
    }

    return false;
}